

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystem.hpp
# Opt level: O1

void __thiscall
webfront::fs::File::File
          (File *this,span<const_unsigned_long,_18446744073709551615UL> input,size_t fileSize,
          string_view contentEncoding)

{
  this->fileType = staticData;
  (this->data)._M_ptr = input._M_ptr;
  (this->data)._M_extent._M_extent_value = input._M_extent._M_extent_value._M_extent_value;
  this->readIndex = 0;
  this->size = fileSize;
  this->eofBit = fileSize == 0;
  (this->encoding)._M_dataplus._M_p = (pointer)&(this->encoding).field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&this->encoding,contentEncoding._M_str,
             contentEncoding._M_str + contentEncoding._M_len);
  std::ifstream::ifstream(&this->fstream);
  return;
}

Assistant:

File(std::span<const uint64_t> input, size_t fileSize, std::string_view contentEncoding = "")
        : fileType{FileType::staticData}, data(input), size(fileSize), eofBit(fileSize==0), encoding(contentEncoding) {}